

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

ostream * __thiscall
dynamicgraph::SignalPtr<double,_int>::writeGraph(SignalPtr<double,_int> *this,ostream *os)

{
  bool bVar1;
  uint uVar2;
  SignalBase<int> *pSVar3;
  ostream *poVar4;
  string local_a8 [8];
  string itNodeName;
  string itLocalName;
  undefined1 local_58 [8];
  string LeaderNodeName;
  string LeaderLocalName;
  ostream *os_local;
  SignalPtr<double,_int> *this_local;
  
  std::__cxx11::string::string((string *)(LeaderNodeName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  SignalBase<int>::ExtractNodeAndLocalNames
            ((SignalBase<int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]),
             (string *)(LeaderNodeName.field_2._M_local_buf + 8),(string *)local_58);
  uVar2 = (*this->_vptr_SignalPtr[6])();
  if (((uVar2 & 1) != 0) && (bVar1 = autoref(this), !bVar1)) {
    std::__cxx11::string::string((string *)(itNodeName.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_a8);
    pSVar3 = getAbstractPtr(this);
    (*pSVar3->_vptr_SignalBase[0x16])(pSVar3,(undefined1 *)((long)&itNodeName.field_2 + 8),local_a8)
    ;
    poVar4 = std::operator<<(os,"\t\"");
    poVar4 = std::operator<<(poVar4,local_a8);
    poVar4 = std::operator<<(poVar4,"\" -> \"");
    poVar4 = std::operator<<(poVar4,(string *)local_58);
    poVar4 = std::operator<<(poVar4,"\"");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"\t [ headlabel = \"");
    poVar4 = std::operator<<(poVar4,(string *)(LeaderNodeName.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"\" , taillabel = \"");
    poVar4 = std::operator<<(poVar4,(string *)(itNodeName.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"\", fontsize=7, fontcolor=red ]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)(itNodeName.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(LeaderNodeName.field_2._M_local_buf + 8));
  return os;
}

Assistant:

std::ostream &SignalPtr<T, Time>::writeGraph(std::ostream &os) const {
  std::string LeaderLocalName;
  std::string LeaderNodeName;
  Signal<T, Time>::ExtractNodeAndLocalNames(LeaderLocalName, LeaderNodeName);
  if (isAbstractPluged() && !autoref()) {
    std::string itLocalName, itNodeName;
    getAbstractPtr()->ExtractNodeAndLocalNames(itLocalName, itNodeName);
    os << "\t\"" << itNodeName << "\" -> \"" << LeaderNodeName << "\""
       << std::endl
       << "\t [ headlabel = \"" << LeaderLocalName << "\" , taillabel = \""
       << itLocalName << "\", fontsize=7, fontcolor=red ]" << std::endl;
  }
  return os;
}